

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O1

int cost_and_tokenize_map
              (Av1ColorMapParam *param,TokenExtra **t,int plane,int calc_rate,int allow_update_cdf,
              FRAME_COUNTS *counts)

{
  aom_cdf_prob *paVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint8_t *puVar6;
  ColorCost paaiVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint8_t tmp_color;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  byte local_8e [4];
  undefined2 local_8a;
  int local_88;
  int local_84;
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  MapCdf paaaStack_60;
  uint8_t color_neighbors [3];
  
  local_84 = calc_rate;
  local_88 = plane;
  uVar4 = param->rows;
  local_68 = (ulong)uVar4;
  uVar15 = (uVar4 + param->cols) - 1;
  iVar23 = 0;
  if (1 < (int)uVar15) {
    puVar6 = param->color_map;
    paaiVar7 = param->color_cost;
    iVar5 = param->plane_width;
    lVar27 = (long)iVar5;
    local_80 = (long)param->n_colors;
    local_70 = (long)param->cols - 1;
    uVar20 = param->n_colors - 1;
    uVar24 = 1;
    if (1 < (int)uVar20) {
      uVar24 = (ulong)uVar20;
    }
    local_78 = (ulong)uVar15;
    iVar23 = 0;
    uVar26 = 1;
    paaaStack_60 = param->map_cdf + (int)(local_80 + -2);
    uVar22 = local_70;
    do {
      iVar25 = (int)uVar26;
      uVar19 = uVar22;
      if (iVar25 < (int)uVar22) {
        uVar19 = uVar26;
      }
      uVar21 = uVar19 & 0xffffffff;
      iVar12 = iVar25 - uVar4;
      if (iVar12 < 0) {
        iVar12 = -1;
      }
      if (iVar12 < (int)uVar19) {
        if ((long)uVar26 < (long)uVar22) {
          uVar22 = uVar26;
        }
        do {
          lVar13 = uVar26 - uVar22;
          if (0 < (long)uVar22 == (lVar13 != 0 && (long)uVar22 <= (long)uVar26)) {
            bVar14 = puVar6[(uVar22 - 1) + lVar13 * lVar27];
            local_8e[3] = bVar14;
            lVar18 = (lVar13 + -1) * lVar27;
            local_8a._0_1_ = puVar6[uVar22 + lVar18];
            local_8a._1_1_ = puVar6[(uVar22 - 1) + lVar18];
            local_8e[2] = 1;
            local_8e[0] = 2;
            local_8e[1] = 2;
            if (bVar14 == (byte)local_8a) {
              local_8e[0] = 4;
              local_8a._0_1_ = 0xff;
              if (bVar14 == local_8a._1_1_) {
                local_8e[0] = 5;
                local_8e[1] = 2;
                lVar18 = 1;
                bVar9 = false;
              }
              else {
LAB_0022f047:
                local_8e[1] = 2;
                lVar18 = 2;
                bVar9 = true;
              }
LAB_0022f04e:
              bVar10 = false;
            }
            else {
              if (bVar14 == local_8a._1_1_) {
                local_8e[0] = 3;
                goto LAB_0022f047;
              }
              lVar18 = 3;
              bVar9 = true;
              if ((byte)local_8a == local_8a._1_1_) {
                local_8e[0] = 2;
                local_8e[1] = 3;
                lVar18 = 2;
                goto LAB_0022f04e;
              }
              bVar10 = true;
            }
            if (bVar9) {
              if ((byte)local_8a == 0xff) {
                local_8e[1] = 1;
                local_8a._0_1_ = local_8a._1_1_;
              }
              bVar11 = local_8e[0];
              if ((local_8e[0] < local_8e[1]) ||
                 ((local_8e[0] == local_8e[1] && ((byte)local_8a < bVar14)))) {
                local_8e[3] = (byte)local_8a;
                local_8e[0] = local_8e[1];
                local_8e[1] = bVar11;
                local_8a._0_1_ = bVar14;
              }
              bVar11 = local_8e[3];
              bVar14 = local_8e[0];
              if (bVar10) {
                if (local_8e[0] == 0) {
                  local_8e[0] = 1;
                  local_8e[3] = local_8a._1_1_;
                  local_8e[2] = bVar14;
                  local_8a._1_1_ = bVar11;
                }
                bVar14 = local_8e[1];
                if (local_8e[1] < local_8e[2]) {
                  local_8a = CONCAT11((byte)local_8a,local_8a._1_1_);
                  local_8e[1] = local_8e[2];
                  local_8e[2] = bVar14;
                }
              }
            }
            bVar14 = puVar6[uVar22 + lVar13 * lVar27];
            uVar20 = (uint)bVar14;
            lVar13 = 0;
            do {
              if (bVar14 < local_8e[lVar13 + 3]) {
                uVar20 = uVar20 + 1;
              }
              else if (local_8e[lVar13 + 3] == bVar14) {
                uVar20 = (uint)lVar13;
                break;
              }
              lVar13 = lVar13 + 1;
            } while (lVar18 != lVar13);
            lVar13 = 0;
            bVar14 = 0;
            do {
              bVar14 = bVar14 + (&av1_fast_palette_color_index_context_hash_multipliers)[lVar13] *
                                local_8e[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar18 != lVar13);
            iVar16 = 9 - (uint)bVar14;
          }
          else {
            iVar16 = iVar25 - (int)uVar21;
            if (lVar13 < 1) {
              iVar17 = iVar16 * iVar5 + (int)uVar22 + -1;
            }
            else {
              iVar17 = (iVar16 + -1) * iVar5 + (int)uVar22;
            }
            bVar14 = puVar6[uVar22 + lVar13 * lVar27];
            uVar20 = (uint)bVar14;
            if (bVar14 < puVar6[iVar17]) {
              uVar20 = uVar20 + 1;
              iVar16 = 0;
            }
            else {
              iVar16 = 0;
              if (puVar6[iVar17] == bVar14) {
                uVar20 = 0;
              }
            }
          }
          if (plane == 0) {
            **t = (TokenExtra)((byte)**t & 0xf8 | (byte)uVar20 & 7);
            **t = (TokenExtra)((byte)**t & 0xf | (char)iVar16 << 4);
            *t = *t + 1;
            if (calc_rate != 0) {
              uVar2 = (*paaaStack_60)[iVar16][local_80];
              bVar14 = (char)(uVar2 >> 4) + (3 < local_80) + 4;
              uVar19 = 0;
              do {
                uVar3 = (*paaaStack_60)[iVar16][uVar19];
                if ((long)uVar19 < (long)(char)(byte)uVar20) {
                  sVar8 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar14 & 0x1f));
                }
                else {
                  sVar8 = -(uVar3 >> (bVar14 & 0x1f));
                }
                (*paaaStack_60)[iVar16][uVar19] = sVar8 + uVar3;
                uVar19 = uVar19 + 1;
              } while (uVar24 != uVar19);
              paVar1 = (*paaaStack_60)[iVar16] + local_80;
              *paVar1 = *paVar1 + (ushort)(uVar2 < 0x20);
            }
          }
          else {
            iVar23 = iVar23 + paaiVar7[local_80 + -2][iVar16][(int)uVar20];
          }
          uVar22 = uVar22 - 1;
          uVar21 = (ulong)((int)uVar21 - 1);
        } while ((long)iVar12 < (long)uVar22);
      }
      uVar26 = uVar26 + 1;
      uVar22 = local_70;
    } while (uVar26 != uVar15);
  }
  if (plane == 0) {
    iVar23 = 0;
  }
  return iVar23;
}

Assistant:

static int cost_and_tokenize_map(Av1ColorMapParam *param, TokenExtra **t,
                                 int plane, int calc_rate, int allow_update_cdf,
                                 FRAME_COUNTS *counts) {
  const uint8_t *const color_map = param->color_map;
  MapCdf map_cdf = param->map_cdf;
  ColorCost color_cost = param->color_cost;
  const int plane_block_width = param->plane_width;
  const int rows = param->rows;
  const int cols = param->cols;
  const int n = param->n_colors;
  const int palette_size_idx = n - PALETTE_MIN_SIZE;
  int this_rate = 0;

  (void)plane;
  (void)counts;

  for (int k = 1; k < rows + cols - 1; ++k) {
    for (int j = AOMMIN(k, cols - 1); j >= AOMMAX(0, k - rows + 1); --j) {
      int i = k - j;
      int color_new_idx;
      const int color_ctx = av1_fast_palette_color_index_context(
          color_map, plane_block_width, i, j, &color_new_idx);
      assert(color_new_idx >= 0 && color_new_idx < n);
      if (calc_rate) {
        this_rate += color_cost[palette_size_idx][color_ctx][color_new_idx];
      } else {
        (*t)->token = color_new_idx;
        (*t)->color_ctx = color_ctx;
        ++(*t);
        if (allow_update_cdf)
          update_cdf(map_cdf[palette_size_idx][color_ctx], color_new_idx, n);
#if CONFIG_ENTROPY_STATS
        if (plane) {
          ++counts->palette_uv_color_index[palette_size_idx][color_ctx]
                                          [color_new_idx];
        } else {
          ++counts->palette_y_color_index[palette_size_idx][color_ctx]
                                         [color_new_idx];
        }
#endif
      }
    }
  }
  if (calc_rate) return this_rate;
  return 0;
}